

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::checkmesh(tetgenmesh *this,int topoflag)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  memorypool *pmVar5;
  void **ppvVar6;
  double *pa;
  double *pb;
  double *pc;
  double *pd;
  ulong uVar7;
  uint uVar8;
  void *pvVar9;
  int (*paiVar10) [12];
  long lVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  uint local_74;
  ulong local_40;
  
  if (this->b->quiet == 0) {
    puts("  Checking consistency of mesh...");
  }
  pmVar5 = this->tetrahedrons;
  ppvVar6 = pmVar5->firstblock;
  pmVar5->pathblock = ppvVar6;
  pmVar5->pathitem =
       (void *)((long)ppvVar6 +
               (((long)pmVar5->alignbytes + 8U) -
               (ulong)(ppvVar6 + 1) % (ulong)(long)pmVar5->alignbytes));
  pmVar5->pathitemsleft = pmVar5->itemsperblock;
  do {
    pvVar9 = memorypool::traverse(this->tetrahedrons);
    if (pvVar9 == (void *)0x0) {
LAB_00148626:
      if (this->b->quiet == 0) {
        puts("  In my studied opinion, the mesh appears to be consistent.");
      }
      return 0;
    }
  } while (*(long *)((long)pvVar9 + 0x20) == 0);
  local_74 = 0;
  do {
    paiVar10 = fsymtbl;
    lVar13 = 0;
    local_40 = 0;
    do {
      pa = *(double **)((long)pvVar9 + (long)*(int *)((long)orgpivot + lVar13) * 8);
      pb = *(double **)((long)pvVar9 + (long)*(int *)((long)destpivot + lVar13) * 8);
      pc = *(double **)((long)pvVar9 + (long)*(int *)((long)apexpivot + lVar13) * 8);
      pd = *(double **)((long)pvVar9 + (long)*(int *)((long)oppopivot + lVar13) * 8);
      if (lVar13 == 0) {
        if (((topoflag == 0) && (*(point *)((long)pvVar9 + 0x38) != this->dummypoint)) &&
           (dVar15 = orient3d(pa,pb,pc,pd), 0.0 <= dVar15)) {
          pcVar12 = "Degenerated";
          if (0.0 < dVar15) {
            pcVar12 = "Inverted";
          }
          printf("  !! !! %s ",pcVar12);
          lVar11 = (long)this->pointmarkindex;
          printf("  (%d, %d, %d, %d) (ori = %.17g)\n",dVar15,(ulong)*(uint *)((long)pa + lVar11 * 4)
                 ,(ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
                 (ulong)*(uint *)((long)pd + lVar11 * 4));
          local_74 = local_74 + 1;
        }
        uVar8 = *(uint *)((long)pvVar9 + (long)this->elemmarkerindex * 4);
        if ((uVar8 & 1) != 0) {
          lVar11 = (long)this->pointmarkindex;
          printf("  !! (%d, %d, %d, %d) is infected.\n",(ulong)*(uint *)((long)pa + lVar11 * 4),
                 (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
                 (ulong)*(uint *)((long)pd + lVar11 * 4));
          local_74 = local_74 + 1;
          uVar8 = *(uint *)((long)pvVar9 + (long)this->elemmarkerindex * 4);
        }
        if ((uVar8 & 2) != 0) {
          lVar11 = (long)this->pointmarkindex;
          printf("  !! (%d, %d, %d, %d) is marked.\n",(ulong)*(uint *)((long)pa + lVar11 * 4),
                 (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
                 (ulong)*(uint *)((long)pd + lVar11 * 4));
          local_74 = local_74 + 1;
        }
      }
      uVar7 = *(ulong *)((long)pvVar9 + lVar13 * 2);
      if (uVar7 == 0) {
        lVar11 = (long)this->pointmarkindex;
        printf("  !! !! No neighbor at face (%d, %d, %d).\n",(ulong)*(uint *)((long)pa + lVar11 * 4)
               ,(ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4));
        local_74 = local_74 + 1;
      }
      else {
        uVar14 = uVar7 & 0xfffffffffffffff0;
        if (uVar14 == 0) {
          lVar11 = (long)this->pointmarkindex;
          uVar8 = *(uint *)((long)pa + lVar11 * 4);
          uVar2 = *(uint *)((long)pb + lVar11 * 4);
          uVar3 = *(uint *)((long)pc + lVar11 * 4);
          uVar1 = *(uint *)((long)pd + lVar11 * 4);
          pcVar12 = "  !! !! Tet-face has no neighbor (%d, %d, %d) - %d:\n";
        }
        else {
          uVar1 = (*paiVar10)[(uint)uVar7 & 0xf];
          uVar7 = *(ulong *)(uVar14 + (ulong)(uVar1 & 3) * 8);
          pcVar12 = "  !! !! Asymmetric tetra-tetra bond:";
          if (pvVar9 == (void *)(uVar7 & 0xfffffffffffffff0)) {
            if (local_40 != (uint)fsymtbl[(int)uVar1][(uint)uVar7 & 0xf]) {
              puts("  !! !! Asymmetric tetra-tetra bond:");
              pcVar12 = "   (Right tetrahedron, wrong orientation)";
              goto LAB_001481b3;
            }
          }
          else {
LAB_001481b3:
            puts(pcVar12);
            lVar11 = (long)this->pointmarkindex;
            printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar11 * 4),
                   (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
                   (ulong)*(uint *)((long)pd + lVar11 * 4));
            lVar11 = (long)this->pointmarkindex;
            printf("    Second: (%d, %d, %d, %d)\n",
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)orgpivot[(int)uVar1] * 8) + lVar11 * 4)
                   ,(ulong)*(uint *)(*(long *)(uVar14 + (long)destpivot[(int)uVar1] * 8) +
                                    lVar11 * 4),
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)apexpivot[(int)uVar1] * 8) + lVar11 * 4
                                   ),
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)oppopivot[(int)uVar1] * 8) + lVar11 * 4
                                   ));
            local_74 = local_74 + 1;
          }
          if ((*(double **)(uVar14 + (long)orgpivot[(int)uVar1] * 8) != pb) ||
             (*(double **)(uVar14 + (long)destpivot[(int)uVar1] * 8) != pa)) {
            puts("  !! !! Wrong edge-edge bond:");
            lVar11 = (long)this->pointmarkindex;
            printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar11 * 4),
                   (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
                   (ulong)*(uint *)((long)pd + lVar11 * 4));
            lVar11 = (long)this->pointmarkindex;
            printf("    Second: (%d, %d, %d, %d)\n",
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)orgpivot[(int)uVar1] * 8) + lVar11 * 4)
                   ,(ulong)*(uint *)(*(long *)(uVar14 + (long)destpivot[(int)uVar1] * 8) +
                                    lVar11 * 4),
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)apexpivot[(int)uVar1] * 8) + lVar11 * 4
                                   ),
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)oppopivot[(int)uVar1] * 8) + lVar11 * 4
                                   ));
            local_74 = local_74 + 1;
          }
          if (*(double **)(uVar14 + (long)apexpivot[(int)uVar1] * 8) != pc) {
            puts("  !! !! Wrong face-face bond:");
            lVar11 = (long)this->pointmarkindex;
            printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar11 * 4),
                   (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
                   (ulong)*(uint *)((long)pd + lVar11 * 4));
            lVar11 = (long)this->pointmarkindex;
            printf("    Second: (%d, %d, %d, %d)\n",
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)orgpivot[(int)uVar1] * 8) + lVar11 * 4)
                   ,(ulong)*(uint *)(*(long *)(uVar14 + (long)destpivot[(int)uVar1] * 8) +
                                    lVar11 * 4),
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)apexpivot[(int)uVar1] * 8) + lVar11 * 4
                                   ),
                   (ulong)*(uint *)(*(long *)(uVar14 + (long)oppopivot[(int)uVar1] * 8) + lVar11 * 4
                                   ));
            local_74 = local_74 + 1;
          }
          if (*(double **)(uVar14 + (long)oppopivot[(int)uVar1] * 8) != pd) goto LAB_001484bf;
          puts("  !! !! Two identical tetra:");
          lVar11 = (long)this->pointmarkindex;
          printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar11 * 4),
                 (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
                 (ulong)*(uint *)((long)pd + lVar11 * 4));
          lVar11 = (long)this->pointmarkindex;
          uVar8 = *(uint *)(*(long *)(uVar14 + (long)orgpivot[(int)uVar1] * 8) + lVar11 * 4);
          uVar2 = *(uint *)(*(long *)(uVar14 + (long)destpivot[(int)uVar1] * 8) + lVar11 * 4);
          uVar3 = *(uint *)(*(long *)(uVar14 + (long)apexpivot[(int)uVar1] * 8) + lVar11 * 4);
          uVar1 = *(uint *)(*(long *)(uVar14 + (long)oppopivot[(int)uVar1] * 8) + lVar11 * 4);
          pcVar12 = "    Second: (%d, %d, %d, %d)\n";
        }
        printf(pcVar12,(ulong)uVar8,(ulong)uVar2,(ulong)uVar3,(ulong)uVar1);
        local_74 = local_74 + 1;
      }
LAB_001484bf:
      if ((*(uint *)((long)pvVar9 + (long)this->elemmarkerindex * 4) >> ((byte)local_40 & 0x1f) & 4)
          != 0) {
        lVar11 = (long)this->pointmarkindex;
        printf("  !! tetface (%d, %d, %d) %d is marked.\n",(ulong)*(uint *)((long)pa + lVar11 * 4),
               (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
               (ulong)*(uint *)((long)pd + lVar11 * 4));
      }
      local_40 = local_40 + 1;
      lVar13 = lVar13 + 4;
      paiVar10 = paiVar10 + 1;
    } while (lVar13 != 0x10);
    lVar13 = 0;
    do {
      iVar4 = *(int *)((long)edge2ver + lVar13);
      if ((*(uint *)((long)pvVar9 + (long)this->elemmarkerindex * 4) >>
           (*(byte *)(ver2edge + iVar4) & 0x1f) & 0x40) != 0) {
        lVar11 = (long)this->pointmarkindex;
        printf("  !! tetedge (%d, %d) %d, %d is marked.\n",
               (ulong)*(uint *)(*(long *)((long)pvVar9 + (long)orgpivot[iVar4] * 8) + lVar11 * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar9 + (long)destpivot[iVar4] * 8) + lVar11 * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar9 + (long)apexpivot[iVar4] * 8) + lVar11 * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar9 + (long)oppopivot[iVar4] * 8) + lVar11 * 4));
      }
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x18);
    do {
      pvVar9 = memorypool::traverse(this->tetrahedrons);
      if (pvVar9 == (void *)0x0) {
        if (local_74 != 0) {
          pcVar12 = "abnormities";
          if (1 < (int)local_74) {
            pcVar12 = "abnormity";
          }
          printf("  !! !! !! !! %d %s witnessed.\n",(ulong)local_74,pcVar12);
          return local_74;
        }
        goto LAB_00148626;
      }
    } while (*(long *)((long)pvVar9 + 0x20) == 0);
  } while( true );
}

Assistant:

int tetgenmesh::checkmesh(int topoflag)
{
  triface tetloop, neightet, symtet;
  point pa, pb, pc, pd;
  REAL ori;
  int horrors, i;

  if (!b->quiet) {
    printf("  Checking consistency of mesh...\n");
  }

  horrors = 0;
  tetloop.ver = 0;
  // Run through the list of tetrahedra, checking each one.
  tetrahedrons->traversalinit();
  tetloop.tet = alltetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Check all four faces of the tetrahedron.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      pa = org(tetloop);
      pb = dest(tetloop);
      pc = apex(tetloop);
      pd = oppo(tetloop);
      if (tetloop.ver == 0) {  // Only test for inversion once.
        if (!ishulltet(tetloop)) {  // Only do test if it is not a hull tet.
          if (!topoflag) {
            ori = orient3d(pa, pb, pc, pd);
            if (ori >= 0.0) {
              printf("  !! !! %s ", ori > 0.0 ? "Inverted" : "Degenerated");
              printf("  (%d, %d, %d, %d) (ori = %.17g)\n", pointmark(pa),
                     pointmark(pb), pointmark(pc), pointmark(pd), ori);
              horrors++;
            }
          }
        }
        if (infected(tetloop)) { 
          // This may be a bug. Report it.
          printf("  !! (%d, %d, %d, %d) is infected.\n", pointmark(pa),
                 pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
        if (marktested(tetloop)) {
          // This may be a bug. Report it.
          printf("  !! (%d, %d, %d, %d) is marked.\n", pointmark(pa),
                 pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
      }
      if (tetloop.tet[tetloop.ver] == NULL) {
        printf("  !! !! No neighbor at face (%d, %d, %d).\n", pointmark(pa),
               pointmark(pb), pointmark(pc));
        horrors++;
      } else {
        // Find the neighboring tetrahedron on this face.
        fsym(tetloop, neightet);
        if (neightet.tet != NULL) {
          // Check that the tetrahedron's neighbor knows it's a neighbor.
          fsym(neightet, symtet);
          if ((tetloop.tet != symtet.tet) || (tetloop.ver != symtet.ver)) {
            printf("  !! !! Asymmetric tetra-tetra bond:\n");
            if (tetloop.tet == symtet.tet) {
              printf("   (Right tetrahedron, wrong orientation)\n");
            }
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same edge (the bond() operation).
          if ((org(neightet) != pb) || (dest(neightet) != pa)) {
            printf("  !! !! Wrong edge-edge bond:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same apex.
          if (apex(neightet) != pc) {
            printf("  !! !! Wrong face-face bond:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same opposite.
          if (oppo(neightet) == pd) {
            printf("  !! !! Two identical tetra:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
        } else {
          printf("  !! !! Tet-face has no neighbor (%d, %d, %d) - %d:\n",
                 pointmark(pa), pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
      }
      if (facemarked(tetloop)) {
        // This may be a bug. Report it.
        printf("  !! tetface (%d, %d, %d) %d is marked.\n", pointmark(pa),
               pointmark(pb), pointmark(pc), pointmark(pd));
      }
    }
    // Check the six edges of this tet.
    for (i = 0; i < 6; i++) {
      tetloop.ver = edge2ver[i];
      if (edgemarked(tetloop)) {
        // This may be a bug. Report it.
        printf("  !! tetedge (%d, %d) %d, %d is marked.\n", 
               pointmark(org(tetloop)), pointmark(dest(tetloop)), 
               pointmark(apex(tetloop)), pointmark(oppo(tetloop)));
      }
    }
    tetloop.tet = alltetrahedrontraverse();
  }
  if (horrors == 0) {
    if (!b->quiet) {
      printf("  In my studied opinion, the mesh appears to be consistent.\n");
    }
  } else {
    printf("  !! !! !! !! %d %s witnessed.\n", horrors, 
           horrors > 1 ? "abnormity" : "abnormities");
  }

  return horrors;
}